

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

void __thiscall
mapbox::detail::Earcut<unsigned_int>::eliminateHole
          (Earcut<unsigned_int> *this,Node *hole,Node *outerNode)

{
  Node *pNVar1;
  Node *in_RSI;
  Node *in_RDI;
  Earcut<unsigned_int> *unaff_retaddr;
  Node *b;
  Node *in_stack_00000068;
  Node *in_stack_00000070;
  Earcut<unsigned_int> *in_stack_00000078;
  
  pNVar1 = findHoleBridge(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  if (pNVar1 != (Node *)0x0) {
    splitPolygon((Earcut<unsigned_int> *)outerNode,b,(Node *)unaff_retaddr);
    filterPoints(unaff_retaddr,in_RDI,in_RSI);
    filterPoints(unaff_retaddr,in_RDI,in_RSI);
  }
  return;
}

Assistant:

void Earcut<N>::eliminateHole(Node* hole, Node* outerNode) {
    outerNode = findHoleBridge(hole, outerNode);
    if (outerNode) {
        Node* b = splitPolygon(outerNode, hole);

        // filter out colinear points around cuts
        filterPoints(outerNode, outerNode->next);
        filterPoints(b, b->next);
    }
}